

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultConverters.cpp
# Opt level: O0

void genericCS16toCU8(void *srcBuff,void *dstBuff,size_t numElems,double scaler)

{
  uint8_t uVar1;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  long in_RSI;
  size_t i;
  uint8_t *dst;
  int16_t *src;
  size_t elemDepth;
  undefined8 local_40;
  
  for (local_40 = 0; local_40 < (ulong)(CONCAT71(in_register_00000011,in_DL) << 1);
      local_40 = local_40 + 1) {
    uVar1 = SoapySDR::S16toU8(0);
    *(uint8_t *)(in_RSI + local_40) = uVar1;
  }
  return;
}

Assistant:

static void genericCS16toCU8(const void *srcBuff, void *dstBuff, const size_t numElems, const double scaler)
{
  const size_t elemDepth = 2;

  auto *src = (int16_t*)srcBuff;
  auto *dst = (uint8_t*)dstBuff;
  for (size_t i = 0; i < numElems*elemDepth; i++)
    {
      dst[i] = SoapySDR::S16toU8(src[i] * scaler);
    }
}